

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::AddRequiredTargetCFeature(cmMakefile *this,cmTarget *target,string *feature)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *test;
  char **ppcVar4;
  char **ppcVar5;
  ostream *poVar6;
  byte bVar7;
  bool bVar8;
  bool needC11;
  bool needC99;
  bool needC90;
  cmTarget *local_270;
  string local_268;
  cmStrCmp local_248;
  cmStrCmp local_228;
  cmStrCmp local_208;
  cmStrCmp local_1e8;
  cmStrCmp local_1c8;
  ostringstream e;
  
  needC90 = false;
  needC99 = false;
  needC11 = false;
  CheckNeededCLanguage(this,feature,&needC90,&needC99,&needC11);
  std::__cxx11::string::string((string *)&e,"C_STANDARD",(allocator *)&local_268);
  test = cmTarget::GetProperty(target,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  local_270 = target;
  if (test == (char *)0x0) {
    ppcVar4 = (char **)&DAT_00595a48;
  }
  else {
    cmStrCmp::cmStrCmp(&local_1c8,test);
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_00595a48,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    if (ppcVar4 == (char **)&DAT_00595a48) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar6 = std::operator<<((ostream *)&e,"The C_STANDARD property on target \"");
      poVar6 = std::operator<<(poVar6,(string *)&target->Name);
      poVar6 = std::operator<<(poVar6,"\" contained an invalid value: \"");
      poVar6 = std::operator<<(poVar6,test);
      std::operator<<(poVar6,"\".");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_268,false);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return false;
    }
    cmStrCmp::cmStrCmp(&local_1e8,test);
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_00595a48,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  bVar3 = needC90;
  bVar2 = needC99;
  bVar1 = needC11;
  bVar8 = test == (char *)0x0;
  if ((!bVar8 & needC11) == 1) {
    cmStrCmp::cmStrCmp(&local_208,"11");
    ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_00595a48,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    if (ppcVar5 <= ppcVar4) goto LAB_0028dc84;
LAB_0028dd37:
    std::__cxx11::string::string((string *)&e,"C_STANDARD",(allocator *)&local_268);
    cmTarget::SetProperty(local_270,(string *)&e,"11");
  }
  else {
LAB_0028dc84:
    if (test == (char *)0x0 || bVar2 != true) {
LAB_0028dcdc:
      bVar7 = bVar8 & bVar3;
      if (test != (char *)0x0 && bVar3 == true) {
        cmStrCmp::cmStrCmp(&local_248,"90");
        ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                            (C_STANDARDS,(char **)&DAT_00595a48,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        bVar7 = bVar7 | ppcVar4 < ppcVar5;
      }
      if ((bVar1 & bVar8) != 0) goto LAB_0028dd37;
      if ((bVar8 & bVar2) == 0) {
        if (bVar7 == 0) {
          return true;
        }
        std::__cxx11::string::string((string *)&e,"C_STANDARD",(allocator *)&local_268);
        cmTarget::SetProperty(local_270,(string *)&e,"90");
        std::__cxx11::string::~string((string *)&e);
        return true;
      }
    }
    else {
      cmStrCmp::cmStrCmp(&local_228,"99");
      ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                          (C_STANDARDS,(char **)&DAT_00595a48,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      if (ppcVar5 <= ppcVar4) goto LAB_0028dcdc;
      if ((bVar1 & bVar8) != 0) goto LAB_0028dd37;
    }
    std::__cxx11::string::string((string *)&e,"C_STANDARD",(allocator *)&local_268);
    cmTarget::SetProperty(local_270,(string *)&e,"99");
  }
  std::__cxx11::string::~string((string *)&e);
  return true;
}

Assistant:

bool cmMakefile::
AddRequiredTargetCFeature(cmTarget *target, const std::string& feature) const
{
  bool needC90 = false;
  bool needC99 = false;
  bool needC11 = false;

  this->CheckNeededCLanguage(feature, needC90, needC99, needC11);

  const char *existingCStandard = target->GetProperty("C_STANDARD");
  if (existingCStandard)
    {
    if (std::find_if(cmArrayBegin(C_STANDARDS), cmArrayEnd(C_STANDARDS),
                  cmStrCmp(existingCStandard)) == cmArrayEnd(C_STANDARDS))
      {
      std::ostringstream e;
      e << "The C_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCStandard << "\".";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return false;
      }
    }
  const char * const *existingCIt = existingCStandard
                                    ? std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp(existingCStandard))
                                    : cmArrayEnd(C_STANDARDS);

  bool setC90 = needC90 && !existingCStandard;
  bool setC99 = needC99 && !existingCStandard;
  bool setC11 = needC11 && !existingCStandard;

  if (needC11 && existingCStandard && existingCIt <
                                    std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp("11")))
    {
    setC11 = true;
    }
  else if(needC99 && existingCStandard && existingCIt <
                                    std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp("99")))
    {
    setC99 = true;
    }
  else if(needC90 && existingCStandard && existingCIt <
                                    std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp("90")))
    {
    setC90 = true;
    }

  if (setC11)
    {
    target->SetProperty("C_STANDARD", "11");
    }
  else if (setC99)
    {
    target->SetProperty("C_STANDARD", "99");
    }
  else if (setC90)
    {
    target->SetProperty("C_STANDARD", "90");
    }
  return true;
}